

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtreeColumn(sqlite3_vtab_cursor *cur,sqlite3_context *ctx,int i)

{
  sqlite3_vtab_cursor *ppStmt;
  byte bVar1;
  sqlite3_vtab *psVar2;
  u8 *puVar3;
  int iVar4;
  RtreeNode *pRVar5;
  sqlite3_value *pFrom;
  i64 iValue;
  long lVar6;
  sqlite3_vtab *psVar7;
  sqlite3_vtab *pStmt;
  MemValue val;
  Mem *pMem;
  int local_34;
  
  if (*(char *)((long)&cur[1].pVtab + 1) == '\0') {
    if (*(int *)((long)&cur[4].pVtab + 4) == 0) {
      psVar7 = (sqlite3_vtab *)0x0;
    }
    else {
      psVar7 = cur[6].pVtab;
    }
  }
  else {
    psVar7 = (sqlite3_vtab *)(cur + 8);
  }
  psVar2 = cur->pVtab;
  local_34 = 0;
  pRVar5 = rtreeNodeOfFirstSearchPoint((RtreeCursor *)cur,&local_34);
  if (local_34 != 0) {
    return local_34;
  }
  if (psVar7 == (sqlite3_vtab *)0x0) {
    return 0;
  }
  if (i == 0) {
    val.i = readInt64(pRVar5->zData +
                      (ulong)(byte)psVar2[1].field_0xf *
                      (ulong)*(byte *)((long)&psVar7->zErrMsg + 2) + 4);
    pMem = ctx->pOut;
    if ((pMem->flags & 0x2400) == 0) {
      (pMem->u).i = (i64)val;
      goto LAB_001dee97;
    }
  }
  else {
    bVar1 = psVar2[1].field_0xd;
    if ((int)(uint)bVar1 < i) {
      if (*(char *)((long)&cur[1].pVtab + 2) == '\0') {
        ppStmt = cur + 7;
        pStmt = cur[7].pVtab;
        if (pStmt == (sqlite3_vtab *)0x0) {
          iVar4 = sqlite3LockAndPrepare
                            ((sqlite3 *)psVar2[1].pModule,psVar2[3].zErrMsg,-1,0x80,(Vdbe *)0x0,
                             (sqlite3_stmt **)ppStmt,(char **)0x0);
          if (iVar4 != 0) {
            return iVar4;
          }
          pStmt = ppStmt->pVtab;
        }
        iValue = readInt64(pRVar5->zData +
                           (ulong)(byte)psVar2[1].field_0xf *
                           (ulong)*(byte *)((long)&psVar7->zErrMsg + 2) + 4);
        sqlite3_bind_int64((sqlite3_stmt *)pStmt,1,iValue);
        iVar4 = sqlite3_step((sqlite3_stmt *)ppStmt->pVtab);
        if (iVar4 != 100) {
          sqlite3_reset((sqlite3_stmt *)ppStmt->pVtab);
          if (iVar4 == 0x65) {
            return 0;
          }
          return iVar4;
        }
        *(undefined1 *)((long)&cur[1].pVtab + 2) = 1;
        bVar1 = psVar2[1].field_0xd;
      }
      pFrom = sqlite3_column_value((sqlite3_stmt *)cur[7].pVtab,(i - (uint)bVar1) + 1);
      sqlite3VdbeMemCopy(ctx->pOut,pFrom);
      return 0;
    }
    puVar3 = pRVar5->zData;
    lVar6 = (long)(int)((uint)(byte)psVar2[1].field_0xf *
                        (uint)*(byte *)((long)&psVar7->zErrMsg + 2) + i * 4 + 8);
    val.i = (ulong)puVar3[lVar6 + 3] |
            (ulong)puVar3[lVar6 + 2] << 8 |
            (long)(int)((uint)puVar3[lVar6] << 0x18) | (ulong)puVar3[lVar6 + 1] << 0x10;
    if (psVar2[1].field_0xe == '\0') {
      sqlite3VdbeMemSetDouble(ctx->pOut,(double)(float)val.nZero);
      return 0;
    }
    pMem = ctx->pOut;
    if ((pMem->flags & 0x2400) == 0) {
      pMem->u = val;
LAB_001dee97:
      pMem->flags = 4;
      return 0;
    }
  }
  vdbeReleaseAndSetInt64(pMem,val.i);
  return 0;
}

Assistant:

static int rtreeColumn(sqlite3_vtab_cursor *cur, sqlite3_context *ctx, int i){
  Rtree *pRtree = (Rtree *)cur->pVtab;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  RtreeSearchPoint *p = rtreeSearchPointFirst(pCsr);
  RtreeCoord c;
  int rc = SQLITE_OK;
  RtreeNode *pNode = rtreeNodeOfFirstSearchPoint(pCsr, &rc);

  if( rc ) return rc;
  if( p==0 ) return SQLITE_OK;
  if( i==0 ){
    sqlite3_result_int64(ctx, nodeGetRowid(pRtree, pNode, p->iCell));
  }else if( i<=pRtree->nDim2 ){
    nodeGetCoord(pRtree, pNode, p->iCell, i-1, &c);
#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      sqlite3_result_double(ctx, c.f);
    }else
#endif
    {
      assert( pRtree->eCoordType==RTREE_COORD_INT32 );
      sqlite3_result_int(ctx, c.i);
    }
  }else{
    if( !pCsr->bAuxValid ){
      if( pCsr->pReadAux==0 ){
        rc = sqlite3_prepare_v3(pRtree->db, pRtree->zReadAuxSql, -1, 0,
                                &pCsr->pReadAux, 0);
        if( rc ) return rc;
      }
      sqlite3_bind_int64(pCsr->pReadAux, 1, 
          nodeGetRowid(pRtree, pNode, p->iCell));
      rc = sqlite3_step(pCsr->pReadAux);
      if( rc==SQLITE_ROW ){
        pCsr->bAuxValid = 1;
      }else{
        sqlite3_reset(pCsr->pReadAux);
        if( rc==SQLITE_DONE ) rc = SQLITE_OK;
        return rc;
      }
    }
    sqlite3_result_value(ctx,
         sqlite3_column_value(pCsr->pReadAux, i - pRtree->nDim2 + 1));
  }  
  return SQLITE_OK;
}